

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O2

FIOBJ fiobj_hash_remove2(FIOBJ hash,uint64_t hash_value)

{
  FIOBJ old;
  
  if (((uint)hash & 7) == 4) {
    old = 0;
    fio_hash___remove((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8),hash_value,
                      0xffffffffffffffff,&old);
    return old;
  }
  __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                ,0x106,"FIOBJ fiobj_hash_remove2(FIOBJ, uint64_t)");
}

Assistant:

FIOBJ fiobj_hash_remove2(FIOBJ hash, uint64_t hash_value) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  FIOBJ old = FIOBJ_INVALID;
  fio_hash___remove(&obj2hash(hash)->hash, hash_value, -1, &old);
  return old;
}